

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O0

int32_t uset_toPattern_63(USet *set,UChar *result,int32_t resultCapacity,UBool escapeUnprintable,
                         UErrorCode *ec)

{
  int32_t iVar1;
  Char16Ptr local_80 [3];
  undefined1 local_68 [8];
  UnicodeString pat;
  UErrorCode *ec_local;
  UBool escapeUnprintable_local;
  int32_t resultCapacity_local;
  UChar *result_local;
  USet *set_local;
  
  pat.fUnion._48_8_ = ec;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_68);
  icu_63::UnicodeSet::toPattern((UnicodeSet *)set,(UnicodeString *)local_68,escapeUnprintable);
  icu_63::Char16Ptr::Char16Ptr(local_80,result);
  iVar1 = icu_63::UnicodeString::extract
                    ((UnicodeString *)local_68,local_80,resultCapacity,
                     (UErrorCode *)pat.fUnion._48_8_);
  icu_63::Char16Ptr::~Char16Ptr(local_80);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_68);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uset_toPattern(const USet* set,
               UChar* result, int32_t resultCapacity,
               UBool escapeUnprintable,
               UErrorCode* ec) {
    UnicodeString pat;
    ((const UnicodeSet*) set)->toPattern(pat, escapeUnprintable);
    return pat.extract(result, resultCapacity, *ec);
}